

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux_joystick.c
# Opt level: O2

void openJoystickDevice(char *path)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  void *pvVar4;
  long lVar5;
  char buttonCount;
  char axisCount;
  int version;
  char name [256];
  
  for (lVar5 = 0; lVar5 != 0x380; lVar5 = lVar5 + 0x38) {
    if ((*(int *)((long)&_glfw.linux_js.js[0].present + lVar5) != 0) &&
       (iVar1 = strcmp(*(char **)((long)&_glfw.linux_js.js[0].path + lVar5),path), iVar1 == 0)) {
      return;
    }
  }
  lVar5 = 0;
  while( true ) {
    if (lVar5 == 0x380) {
      return;
    }
    if (*(int *)((long)&_glfw.linux_js.js[0].present + lVar5) == 0) break;
    lVar5 = lVar5 + 0x38;
  }
  iVar1 = open(path,0x800);
  if (iVar1 == -1) {
    return;
  }
  *(int *)((long)&_glfw.linux_js.js[0].fd + lVar5) = iVar1;
  ioctl(iVar1,0x80046a01,&version);
  if (version < 0x10000) {
    close(iVar1);
    return;
  }
  iVar2 = ioctl(iVar1,0x81006a13,name);
  if (iVar2 < 0) {
    strncpy(name,"Unknown",0x100);
  }
  pcVar3 = strdup(name);
  *(char **)((long)&_glfw.linux_js.js[0].name + lVar5) = pcVar3;
  pcVar3 = strdup(path);
  *(char **)((long)&_glfw.linux_js.js[0].path + lVar5) = pcVar3;
  ioctl(iVar1,0x80016a11,&axisCount);
  *(int *)((long)&_glfw.linux_js.js[0].axisCount + lVar5) = (int)axisCount;
  ioctl(iVar1,0x80016a12,&buttonCount);
  *(int *)((long)&_glfw.linux_js.js[0].buttonCount + lVar5) = (int)buttonCount;
  pvVar4 = calloc((long)axisCount,4);
  *(void **)((long)&_glfw.linux_js.js[0].axes + lVar5) = pvVar4;
  pvVar4 = calloc((long)buttonCount,1);
  *(void **)((long)&_glfw.linux_js.js[0].buttons + lVar5) = pvVar4;
  *(undefined4 *)((long)&_glfw.linux_js.js[0].present + lVar5) = 1;
  return;
}

Assistant:

static void openJoystickDevice(const char* path)
{
#if defined(__linux__)
    char axisCount, buttonCount;
    char name[256];
    int joy, fd, version;

    for (joy = GLFW_JOYSTICK_1;  joy <= GLFW_JOYSTICK_LAST;  joy++)
    {
        if (!_glfw.linux_js.js[joy].present)
            continue;

        if (strcmp(_glfw.linux_js.js[joy].path, path) == 0)
            return;
    }

    for (joy = GLFW_JOYSTICK_1;  joy <= GLFW_JOYSTICK_LAST;  joy++)
    {
        if (!_glfw.linux_js.js[joy].present)
            break;
    }

    if (joy > GLFW_JOYSTICK_LAST)
        return;

    fd = open(path, O_RDONLY | O_NONBLOCK);
    if (fd == -1)
        return;

    _glfw.linux_js.js[joy].fd = fd;

    // Verify that the joystick driver version is at least 1.0
    ioctl(fd, JSIOCGVERSION, &version);
    if (version < 0x010000)
    {
        // It's an old 0.x interface (we don't support it)
        close(fd);
        return;
    }

    if (ioctl(fd, JSIOCGNAME(sizeof(name)), name) < 0)
        strncpy(name, "Unknown", sizeof(name));

    _glfw.linux_js.js[joy].name = strdup(name);
    _glfw.linux_js.js[joy].path = strdup(path);

    ioctl(fd, JSIOCGAXES, &axisCount);
    _glfw.linux_js.js[joy].axisCount = (int) axisCount;

    ioctl(fd, JSIOCGBUTTONS, &buttonCount);
    _glfw.linux_js.js[joy].buttonCount = (int) buttonCount;

    _glfw.linux_js.js[joy].axes = calloc(axisCount, sizeof(float));
    _glfw.linux_js.js[joy].buttons = calloc(buttonCount, 1);

    _glfw.linux_js.js[joy].present = GL_TRUE;
#endif // __linux__
}